

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

uint8_t expr_to_ins_arg(Parser *psr,Node *node)

{
  NodeType NVar1;
  uint8_t uVar2;
  ushort uVar3;
  
  expr_discharge(psr,node);
  NVar1 = node->type;
  if (NVar1 != NODE_NON_RELOC) {
    if (NVar1 == NODE_CONST) {
      uVar3 = (node->field_1).const_idx;
      if (uVar3 < 0x100) goto LAB_00111d2e;
    }
    else if (NVar1 != NODE_PRIM) {
      uVar2 = expr_to_next_slot(psr,node);
      return uVar2;
    }
  }
  uVar3 = (ushort)(node->field_1).slot;
LAB_00111d2e:
  return (uint8_t)uVar3;
}

Assistant:

static uint8_t expr_to_ins_arg(Parser *psr, Node *node) {
	// Only deal with discharged values
	expr_discharge(psr, node);
	switch (node->type) {
	case NODE_PRIM:
		return (uint8_t) node->prim;
	case NODE_CONST:
		if (node->const_idx < 256) {
			return (uint8_t) node->const_idx;
		}
	case NODE_NON_RELOC:
		return node->slot;
	default:
		return expr_to_next_slot(psr, node);
	}
}